

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O0

void helper_icbi_ppc64(CPUPPCState_conflict2 *env,target_ulong addr)

{
  uintptr_t unaff_retaddr;
  target_ulong addr_local;
  CPUPPCState_conflict2 *env_local;
  
  cpu_ldl_data_ra_ppc64
            (env,(long)(int)(env->dcache_line_size - 1U ^ 0xffffffff) & addr,unaff_retaddr);
  return;
}

Assistant:

void helper_icbi(CPUPPCState *env, target_ulong addr)
{
    addr &= ~(env->dcache_line_size - 1);
    /*
     * Invalidate one cache line :
     * PowerPC specification says this is to be treated like a load
     * (not a fetch) by the MMU. To be sure it will be so,
     * do the load "by hand".
     */
    cpu_ldl_data_ra(env, addr, GETPC());
}